

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5InitVtab(int bCreate,sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,
                char **pzErr)

{
  u64 n;
  Fts5Config *pFVar1;
  int iVar2;
  int iVar3;
  Fts5FullTable *pTab;
  Fts5Index *pFVar4;
  char *pcVar5;
  Fts5Storage *__s;
  Fts5Structure *pStruct;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  Fts5Config *pConfig;
  int local_5c;
  char *local_58;
  Fts5Config *local_50;
  Fts5Storage *local_48;
  sqlite3_vtab **local_40;
  int local_34;
  
  local_58 = (char *)CONCAT44(local_58._4_4_,bCreate);
  local_34 = 0;
  local_50 = (Fts5Config *)0x0;
  local_40 = ppVTab;
  pTab = (Fts5FullTable *)sqlite3Fts5MallocZero(&local_34,0x40);
  iVar2 = local_34;
  if ((local_34 == 0) &&
     (iVar2 = sqlite3Fts5ConfigParse((Fts5Global *)pAux,db,argc,argv,&local_50,pzErr),
     pFVar1 = local_50, iVar2 == 0)) {
    (pTab->p).pConfig = local_50;
    pTab->pGlobal = (Fts5Global *)pAux;
    local_5c = 0;
    pFVar4 = (Fts5Index *)sqlite3Fts5MallocZero(&local_5c,0x88);
    (pTab->p).pIndex = pFVar4;
    iVar2 = local_5c;
    if (local_5c == 0) {
      pFVar4->pConfig = pFVar1;
      pFVar4->nWorkUnit = 0x40;
      pcVar5 = sqlite3Fts5Mprintf(&local_5c,"%s_data",pFVar1->zName);
      pFVar4->zDataTbl = pcVar5;
      iVar2 = local_5c;
      if (((int)local_58 != 0) && (pcVar5 != (char *)0x0)) {
        iVar2 = sqlite3Fts5CreateTable(pFVar1,"data","id INTEGER PRIMARY KEY, block BLOB",0,pzErr);
        if ((iVar2 != 0) ||
           (iVar2 = sqlite3Fts5CreateTable
                              (pFVar1,"idx","segid, term, pgno, PRIMARY KEY(segid, term)",1,pzErr),
           iVar2 != 0)) goto LAB_0019f761;
        iVar2 = sqlite3Fts5IndexReinit(pFVar4);
      }
      pFVar1 = local_50;
      if (iVar2 == 0) {
        pFVar4 = (pTab->p).pIndex;
        iVar9 = local_50->nCol;
        iVar3 = sqlite3_initialize();
        iVar2 = 7;
        if (iVar3 == 0) {
          n = (long)iVar9 * 8 + 0x80;
          __s = (Fts5Storage *)sqlite3Malloc(n);
          pTab->pStorage = __s;
          if (__s == (Fts5Storage *)0x0) {
            iVar2 = 7;
            goto LAB_0019f771;
          }
          memset(__s,0,n);
          __s->aTotalSize = (i64 *)(__s + 1);
          __s->pConfig = pFVar1;
          __s->pIndex = pFVar4;
          local_48 = __s;
          if ((int)local_58 == 0) {
LAB_0019f899:
            pFVar1 = local_50;
            local_5c = 0;
            pcVar5 = sqlite3Fts5Mprintf(&local_5c,"CREATE TABLE x(");
            if (pcVar5 != (char *)0x0) {
              lVar8 = 0;
              do {
                if (pFVar1->nCol <= lVar8) {
                  pcVar7 = pFVar1->zName;
                  goto LAB_0019f965;
                }
                pcVar7 = ", ";
                if (lVar8 == 0) {
                  pcVar7 = "";
                }
                pcVar5 = sqlite3Fts5Mprintf(&local_5c,"%z%s%Q",pcVar5,pcVar7,pFVar1->azCol[lVar8]);
                lVar8 = lVar8 + 1;
              } while (pcVar5 != (char *)0x0);
            }
            pcVar7 = pFVar1->zName;
            pcVar5 = (char *)0x0;
LAB_0019f965:
            pcVar5 = sqlite3Fts5Mprintf(&local_5c,"%z, %Q HIDDEN, %s HIDDEN)",pcVar5,pcVar7,"rank");
            iVar2 = local_5c;
            if (pcVar5 != (char *)0x0) {
              iVar2 = sqlite3_declare_vtab(pFVar1->db,pcVar5);
              sqlite3_free(pcVar5);
            }
            pFVar1 = local_50;
            if (iVar2 == 0) {
              local_50->pzErrmsg = pzErr;
              pFVar4 = (pTab->p).pIndex;
              pStruct = fts5StructureRead(pFVar4);
              fts5StructureRelease(pStruct);
              iVar2 = pFVar4->rc;
              pFVar4->rc = 0;
              sqlite3Fts5IndexRollback((pTab->p).pIndex);
              pFVar1->pzErrmsg = (char **)0x0;
              if (iVar2 == 0) {
                iVar2 = 0;
                goto LAB_0019f77c;
              }
            }
            goto LAB_0019f771;
          }
          if (pFVar1->eContent == 0) {
            iVar9 = pFVar1->nCol;
            iVar3 = sqlite3_initialize();
            iVar2 = 7;
            if ((iVar3 == 0) &&
               (local_58 = (char *)sqlite3Malloc((long)iVar9 * 10 + 0x20), local_58 != (char *)0x0))
            {
              iVar2 = iVar9 * 10 + 0x20;
              sqlite3_snprintf(iVar2,local_58,"id INTEGER PRIMARY KEY");
              if (0 < pFVar1->nCol) {
                sVar6 = strlen(local_58);
                iVar9 = 0;
                do {
                  iVar3 = (int)sVar6;
                  pcVar5 = local_58 + iVar3;
                  sqlite3_snprintf(iVar2 - iVar3,pcVar5,", c%d");
                  sVar6 = strlen(pcVar5);
                  sVar6 = (size_t)(uint)(iVar3 + (int)sVar6);
                  iVar9 = iVar9 + 1;
                } while (iVar9 < pFVar1->nCol);
              }
              pcVar5 = local_58;
              iVar2 = sqlite3Fts5CreateTable(pFVar1,"content",local_58,0,pzErr);
              sqlite3_free(pcVar5);
              if (iVar2 == 0) goto LAB_0019f815;
            }
          }
          else {
LAB_0019f815:
            if ((((pFVar1->bColumnsize == 0) ||
                 (iVar2 = sqlite3Fts5CreateTable
                                    (pFVar1,"docsize","id INTEGER PRIMARY KEY, sz BLOB",0,pzErr),
                 iVar2 == 0)) &&
                (iVar2 = sqlite3Fts5CreateTable(pFVar1,"config","k PRIMARY KEY, v",1,pzErr),
                iVar2 == 0)) &&
               (iVar2 = sqlite3Fts5StorageConfigValue(local_48,"version",(sqlite3_value *)0x0,4),
               iVar2 == 0)) goto LAB_0019f899;
          }
          sqlite3Fts5StorageClose(local_48);
        }
        pTab->pStorage = (Fts5Storage *)0x0;
        goto LAB_0019f771;
      }
    }
LAB_0019f761:
    sqlite3Fts5IndexClose(pFVar4);
    (pTab->p).pIndex = (Fts5Index *)0x0;
  }
LAB_0019f771:
  fts5FreeVtab(pTab);
  pTab = (Fts5FullTable *)0x0;
LAB_0019f77c:
  *local_40 = (sqlite3_vtab *)pTab;
  return iVar2;
}

Assistant:

static int fts5InitVtab(
  int bCreate,                    /* True for xCreate, false for xConnect */
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Hash table containing tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  Fts5Global *pGlobal = (Fts5Global*)pAux;
  const char **azConfig = (const char**)argv;
  int rc = SQLITE_OK;             /* Return code */
  Fts5Config *pConfig = 0;        /* Results of parsing argc/argv */
  Fts5FullTable *pTab = 0;        /* New virtual table object */

  /* Allocate the new vtab object and parse the configuration */
  pTab = (Fts5FullTable*)sqlite3Fts5MallocZero(&rc, sizeof(Fts5FullTable));
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5ConfigParse(pGlobal, db, argc, azConfig, &pConfig, pzErr);
    assert( (rc==SQLITE_OK && *pzErr==0) || pConfig==0 );
  }
  if( rc==SQLITE_OK ){
    pTab->p.pConfig = pConfig;
    pTab->pGlobal = pGlobal;
  }

  /* Open the index sub-system */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexOpen(pConfig, bCreate, &pTab->p.pIndex, pzErr);
  }

  /* Open the storage sub-system */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5StorageOpen(
        pConfig, pTab->p.pIndex, bCreate, &pTab->pStorage, pzErr
    );
  }

  /* Call sqlite3_declare_vtab() */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5ConfigDeclareVtab(pConfig);
  }

  /* Load the initial configuration */
  if( rc==SQLITE_OK ){
    assert( pConfig->pzErrmsg==0 );
    pConfig->pzErrmsg = pzErr;
    rc = sqlite3Fts5IndexLoadConfig(pTab->p.pIndex);
    sqlite3Fts5IndexRollback(pTab->p.pIndex);
    pConfig->pzErrmsg = 0;
  }

  if( rc!=SQLITE_OK ){
    fts5FreeVtab(pTab);
    pTab = 0;
  }else if( bCreate ){
    fts5CheckTransactionState(pTab, FTS5_BEGIN, 0);
  }
  *ppVTab = (sqlite3_vtab*)pTab;
  return rc;
}